

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O0

bool __thiscall EventHandler::vector3Moved(EventHandler *this,JoyStickEvent *arg,int index)

{
  long lVar1;
  _Ios_Fmtflags __fmtfl;
  ostream *poVar2;
  string *psVar3;
  const_reference pvVar4;
  int in_EDX;
  long in_RSI;
  
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),2);
  lVar1 = *(long *)(std::cout + -0x18);
  __fmtfl = std::operator|(_S_fixed,_S_right);
  std::ios_base::flags((ios_base *)((long)&std::cout + lVar1),__fmtfl);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  psVar3 = OIS::Object::vendor_abi_cxx11_(*(Object **)(in_RSI + 8));
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,". Orientation # ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  poVar2 = std::operator<<(poVar2," X Value: ");
  pvVar4 = std::vector<OIS::Vector3,_std::allocator<OIS::Vector3>_>::operator[]
                     ((vector<OIS::Vector3,_std::allocator<OIS::Vector3>_> *)
                      (*(long *)(in_RSI + 0x10) + 0x90),(long)in_EDX);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(pvVar4 + 4));
  poVar2 = std::operator<<(poVar2," Y Value: ");
  pvVar4 = std::vector<OIS::Vector3,_std::allocator<OIS::Vector3>_>::operator[]
                     ((vector<OIS::Vector3,_std::allocator<OIS::Vector3>_> *)
                      (*(long *)(in_RSI + 0x10) + 0x90),(long)in_EDX);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(pvVar4 + 8));
  poVar2 = std::operator<<(poVar2," Z Value: ");
  pvVar4 = std::vector<OIS::Vector3,_std::allocator<OIS::Vector3>_>::operator[]
                     ((vector<OIS::Vector3,_std::allocator<OIS::Vector3>_> *)
                      (*(long *)(in_RSI + 0x10) + 0x90),(long)in_EDX);
  std::ostream::operator<<(poVar2,*(float *)(pvVar4 + 0xc));
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  return true;
}

Assistant:

bool vector3Moved(const JoyStickEvent& arg, int index)
	{
		std::cout.precision(2);
		std::cout.flags(std::ios::fixed | std::ios::right);
		std::cout << std::endl
				  << arg.device->vendor() << ". Orientation # " << index
				  << " X Value: " << arg.state.mVectors[index].x
				  << " Y Value: " << arg.state.mVectors[index].y
				  << " Z Value: " << arg.state.mVectors[index].z;
		std::cout.precision();
		std::cout.flags();
		return true;
	}